

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signed-interest.c
# Opt level: O2

int ndn_signed_interest_hmac_sign
              (ndn_interest_t *interest,ndn_name_t *identity,ndn_hmac_key_t *hmac_key)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ndn_interest_t *component;
  ulong uVar5;
  uint8_t local_2f8 [692];
  uint32_t local_44;
  undefined1 auStack_40 [4];
  uint32_t used_bytes;
  ndn_encoder_t temp_encoder;
  
  if (9 < (interest->name).components_size) {
    return -10;
  }
  _prepare_signature_info(interest,'\x04',identity,hmac_key->key_id);
  memset(local_2f8,0,0x2a8);
  temp_encoder.output_value = (uint8_t *)0x2a8;
  uVar5 = 0xffffffffffffffff;
  component = interest;
  _auStack_40 = local_2f8;
  while (uVar5 = uVar5 + 1, uVar5 < (interest->name).components_size) {
    iVar4 = name_component_tlv_encode((ndn_encoder_t *)auStack_40,(name_component_t *)component);
    component = (ndn_interest_t *)((component->name).components + 1);
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  uVar3 = temp_encoder.output_value._4_4_;
  uVar5 = (ulong)temp_encoder.output_value._4_4_;
  if ((interest->flags & 0x40) != 0) {
    iVar4 = encoder_append_var((ndn_encoder_t *)auStack_40,0x24);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = encoder_append_var((ndn_encoder_t *)auStack_40,(interest->parameters).size);
    if (iVar4 != 0) {
      return iVar4;
    }
    uVar2 = (interest->parameters).size;
    if ((int)((int)temp_encoder.output_value - temp_encoder.output_value._4_4_) < (int)uVar2) {
      return -10;
    }
    memcpy(_auStack_40 + temp_encoder.output_value._4_4_,&interest->parameters,(ulong)uVar2);
    temp_encoder.output_value =
         (uint8_t *)CONCAT44(temp_encoder.output_value._4_4_ + uVar2,(int)temp_encoder.output_value)
    ;
  }
  iVar4 = ndn_signature_info_tlv_encode((ndn_encoder_t *)auStack_40,&interest->signature);
  if (iVar4 != 0) {
    return iVar4;
  }
  local_44 = 0;
  iVar4 = ndn_hmac_sign(_auStack_40,temp_encoder.output_value._4_4_,(interest->signature).sig_value,
                        0x80,hmac_key,&local_44);
  if (iVar4 < 0) {
    return iVar4;
  }
  (interest->signature).sig_size = local_44;
  iVar4 = ndn_signature_value_tlv_encode((ndn_encoder_t *)auStack_40,&interest->signature);
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ndn_sha256(_auStack_40 + uVar5,temp_encoder.output_value._4_4_ - uVar3,
                     (interest->name).components[(interest->name).components_size].value);
  if (iVar4 < 0) {
    return iVar4;
  }
  bVar1 = (interest->name).components_size;
  (interest->name).components[bVar1].type = 2;
  (interest->name).components[bVar1].size = ' ';
  (interest->name).components_size = bVar1 + 1;
  interest->flags = interest->flags | 0x80;
  return 0;
}

Assistant:

int
ndn_signed_interest_hmac_sign(ndn_interest_t* interest,
                              const ndn_name_t* identity, const ndn_hmac_key_t* hmac_key)
{
  int ret_val = -1;
  if (interest->name.components_size + 1 > NDN_NAME_COMPONENTS_SIZE)
    return NDN_OVERSIZE;

  // set signature info
  _prepare_signature_info(interest, NDN_SIG_TYPE_HMAC_SHA256, identity, hmac_key->key_id);

  // update signature value and append the ending name component
  // prepare temp buffer to calculate signature value and the ending name component
  uint8_t be_signed[NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE] = {0};
  ndn_encoder_t temp_encoder;
  encoder_init(&temp_encoder, be_signed, NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE);
  // the signing input starts at Name's Value (V)
  for (size_t i = 0; i < interest->name.components_size; i++) {
    ret_val = name_component_tlv_encode(&temp_encoder, &interest->name.components[i]);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  // the digest input starts at parameters
  uint32_t param_block_starting = temp_encoder.offset;
  if (ndn_interest_has_Parameters(interest)) {
    ret_val = encoder_append_type(&temp_encoder, TLV_ApplicationParameters);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(&temp_encoder, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(&temp_encoder, interest->parameters.value, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  ret_val = ndn_signature_info_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;
  // the signing input ends at signature info
  uint32_t siginfo_block_ending = temp_encoder.offset;

  // calculate signature
  // signature is calculated over Name + Parameters + SignatureInfo
  uint32_t used_bytes = 0;
  int result = NDN_SUCCESS;
  result = ndn_hmac_sign(temp_encoder.output_value, siginfo_block_ending,
                         interest->signature.sig_value, NDN_SIGNATURE_BUFFER_SIZE,
                         hmac_key, &used_bytes);
  if (result < 0) return result;
  interest->signature.sig_size = used_bytes;

  ret_val = ndn_signature_value_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;

  // calculate the SignedInterestSha256DigestComponent
  // component is calculated over Name + Parameters + SignatureInfo + SignatureValue
  result = ndn_sha256(&temp_encoder.output_value[param_block_starting],
                      temp_encoder.offset - param_block_starting,
                      interest->name.components[interest->name.components_size].value);
  if (result < 0) return result;
  interest->name.components[interest->name.components_size].type = TLV_ParametersSha256DigestComponent;
  interest->name.components[interest->name.components_size].size = NDN_SEC_SHA256_HASH_SIZE;
  interest->name.components_size++;
  BIT_SET(interest->flags, 7);
  return NDN_SUCCESS;
}